

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O2

bool __thiscall Clasp::SatElite::backwardSubsume(SatElite *this)

{
  undefined1 *puVar1;
  uint uVar2;
  Clause *other;
  bool bVar3;
  Clause *c;
  ulong uVar4;
  Literal LVar5;
  long lVar6;
  uint uVar7;
  uint32 uVar8;
  uint uVar9;
  OccurList *pOVar10;
  uint v;
  ulong uVar11;
  uint clauseId;
  uint local_64;
  char *__filename;
  
  bVar3 = propagateFacts(this);
joined_r0x00186d5e:
  if (!bVar3) {
    return false;
  }
  do {
    uVar7 = this->qFront_;
    if (uVar7 == (this->queue_).ebo_.size) {
LAB_0018702a:
      (this->queue_).ebo_.size = 0;
      this->qFront_ = 0;
      return true;
    }
    if ((uVar7 & 0x1fff) == 0) {
      bVar3 = timeout(this);
      if (bVar3) goto LAB_0018702a;
      uVar9 = (this->queue_).ebo_.size;
      uVar7 = this->qFront_;
      if (1000 < uVar9) {
        reportProgress(this,event_subsumption,uVar7,uVar9);
        uVar7 = this->qFront_;
      }
    }
    if ((this->super_SatPreprocessor).clauses_.ebo_.buf[(this->queue_).ebo_.buf[uVar7]] !=
        (Clause *)0x0) break;
    this->qFront_ = uVar7 + 1;
  } while( true );
  c = popSubQueue(this);
  uVar8 = c->lits_[0].rep_;
  pOVar10 = this->occurs_;
  for (lVar6 = 4; lVar6 - 3U < (ulong)(*(uint *)&c->field_0x8 & 0x3fffffff); lVar6 = lVar6 + 1) {
    uVar7 = c->lits_[lVar6 + -3].rep_;
    if (((uint)((ulong)*(undefined8 *)&pOVar10[uVar8 >> 2].field_0x18 >> 0x20) & 0x3fffffff) +
        ((uint)*(undefined8 *)&pOVar10[uVar8 >> 2].field_0x18 & 0x3fffffff) <=
        ((uint)((ulong)*(undefined8 *)&pOVar10[uVar7 >> 2].field_0x18 >> 0x20) & 0x3fffffff) +
        ((uint)*(undefined8 *)&pOVar10[uVar7 >> 2].field_0x18 & 0x3fffffff)) {
      uVar7 = uVar8;
    }
    uVar8 = uVar7;
  }
  uVar9 = uVar8 >> 2;
  uVar7 = pOVar10[uVar9].refs.super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.left_;
  pOVar10 = pOVar10 + uVar9;
  local_64 = 0;
  for (uVar11 = 0; uVar7 >> 2 != uVar11; uVar11 = uVar11 + 1) {
    uVar2 = *(uint *)((pOVar10->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.
                      buf_ + uVar11 * 4);
    clauseId = uVar2 >> 2;
    __filename = (char *)(ulong)clauseId;
    other = (this->super_SatPreprocessor).clauses_.ebo_.buf[(long)__filename];
    if (other == c || other == (Clause *)0x0) {
      if (other == (Clause *)0x0) goto LAB_00186fc4;
LAB_00186fac:
      uVar4 = (ulong)local_64;
      local_64 = local_64 + 1;
      if (uVar11 != uVar4) {
        *(uint *)((pOVar10->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.buf_
                 + uVar4 * 4) = uVar2;
      }
    }
    else {
      LVar5.rep_ = ((uVar8 ^ uVar2) & 2) >> 1;
      if (LVar5.rep_ != 0) {
        LVar5.rep_ = uVar8;
      }
      LVar5 = subsumes(this,c,other,LVar5);
      if ((LVar5.rep_ ^ 2) < 2) goto LAB_00186fac;
      if (LVar5.rep_ < 2) {
        detach(this,clauseId);
      }
      else {
        v = LVar5.rep_ >> 2;
        OccurList::remove(this->occurs_ + v,__filename);
        updateHeap(this,v);
        bVar3 = strengthenClause(this,clauseId,(Literal)(LVar5.rep_ & 0xfffffffe ^ 2));
        if (!bVar3) {
          return false;
        }
        if ((v != uVar9) &&
           ((this->super_SatPreprocessor).clauses_.ebo_.buf[(long)__filename] != (Clause *)0x0))
        goto LAB_00186fac;
      }
    }
LAB_00186fc4:
  }
  (pOVar10->refs).super_type.super_left_right_rep<Clasp::Literal,_unsigned_int>.left_ =
       local_64 << 2;
  puVar1 = &this->occurs_[uVar9].field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 & 0xffffffff7fffffff;
  bVar3 = propagateFacts(this);
  goto joined_r0x00186d5e;
}

Assistant:

bool SatElite::backwardSubsume() {
	if (!propagateFacts()) return false;
	while (qFront_ != queue_.size()) {
		if ((qFront_ & 8191) == 0) {
			if (timeout()) break;
			if (queue_.size() > 1000) reportProgress(Progress::event_subsumption, qFront_, queue_.size());
		}
		if (peekSubQueue() == 0) { ++qFront_; continue; }
		Clause& c = *popSubQueue();
		// Try to minimize effort by testing against the var in c that occurs least often;
		Literal best = c[0];
		for (uint32 i = 1; i < c.size(); ++i) {
			if (occurs_[c[i].var()].numOcc() < occurs_[best.var()].numOcc()) {
				best  = c[i];
			}
		}
		// Test against all clauses containing best
		ClWList& cls = occurs_[best.var()].refs;
		Literal res  = lit_false();
		uint32  j    = 0;
		// must use index access because cls might change!
		for (uint32 i = 0, end = cls.left_size(); i != end; ++i) {
			Literal cl     = cls.left(i);
			uint32 otherId = cl.var();
			Clause* other  = clause(otherId);
			if (other && other!= &c && (res = subsumes(c, *other, best.sign()==cl.sign()?lit_true():best)) != lit_false()) {
				if (res == lit_true()) {
					// other is subsumed - remove it
					detach(otherId);
					other = 0;
				}
				else {
					// self-subsumption resolution; other is subsumed by c\{res} U {~res}
					// remove ~res from other, add it to subQ so that we can check if it now subsumes c
					res = ~res;
					occurs_[res.var()].remove(otherId, res.sign(), res.var() != best.var());
					updateHeap(res.var());
					if (!strengthenClause(otherId, res))              { return false; }
					if (res.var() == best.var() || !clause(otherId))  { other = 0; }
				}
			}
			if (other && j++ != i)  { cls.left(j-1) = cl; }
		}
		cls.shrink_left(cls.left_begin()+j);
		occurs_[best.var()].dirty = 0;
		assert(occurs_[best.var()].numOcc() == (uint32)cls.left_size());
		if (!propagateFacts()) return false;
	}
	queue_.clear();
	qFront_ = 0;
	return true;
}